

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_link_resolver.c
# Opt level: O1

links_entry * next_entry(archive_entry_linkresolver *res,int mode)

{
  links_entry **pplVar1;
  links_entry *plVar2;
  links_entry *plVar3;
  links_entry *plVar4;
  size_t sVar5;
  bool bVar6;
  
  if (res->spare != (links_entry *)0x0) {
    archive_entry_free(res->spare->canonical);
    archive_entry_free(res->spare->entry);
    free(res->spare);
    res->spare = (links_entry *)0x0;
  }
  if (res->number_buckets != 0) {
    pplVar1 = res->buckets;
    sVar5 = 0;
    do {
      for (plVar3 = pplVar1[sVar5]; plVar3 != (links_entry *)0x0; plVar3 = plVar3->next) {
        bVar6 = plVar3->entry != (archive_entry *)0x0;
        if (((mode & 1U) != 0 || !bVar6) && ((mode & 2U) != 0 || bVar6)) {
          plVar2 = plVar3->next;
          if (plVar2 != (links_entry *)0x0) {
            plVar2->previous = plVar3->previous;
          }
          plVar4 = (links_entry *)(pplVar1 + sVar5);
          if (plVar3->previous != (links_entry *)0x0) {
            plVar4 = plVar3->previous;
          }
          plVar4->next = plVar2;
          res->number_entries = res->number_entries - 1;
          res->spare = plVar3;
          return plVar3;
        }
      }
      sVar5 = sVar5 + 1;
    } while (sVar5 != res->number_buckets);
  }
  return (links_entry *)0x0;
}

Assistant:

static struct links_entry *
next_entry(struct archive_entry_linkresolver *res, int mode)
{
	struct links_entry	*le;
	size_t			 bucket;

	/* Free a held entry. */
	if (res->spare != NULL) {
		archive_entry_free(res->spare->canonical);
		archive_entry_free(res->spare->entry);
		free(res->spare);
		res->spare = NULL;
	}

	/* Look for next non-empty bucket in the links cache. */
	for (bucket = 0; bucket < res->number_buckets; bucket++) {
		for (le = res->buckets[bucket]; le != NULL; le = le->next) {
			if (le->entry != NULL &&
			    (mode & NEXT_ENTRY_DEFERRED) == 0)
				continue;
			if (le->entry == NULL &&
			    (mode & NEXT_ENTRY_PARTIAL) == 0)
				continue;
			/* Remove it from this hash bucket. */
			if (le->next != NULL)
				le->next->previous = le->previous;
			if (le->previous != NULL)
				le->previous->next = le->next;
			else
				res->buckets[bucket] = le->next;
			res->number_entries--;
			/* Defer freeing this entry. */
			res->spare = le;
			return (le);
		}
	}
	return (NULL);
}